

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

void leveldb::log::_Test_ShortTrailer::_RunIt(void)

{
  _Test_ShortTrailer t;
  LogTest LStack_98;
  
  LogTest::LogTest(&LStack_98);
  _Run((_Test_ShortTrailer *)&LStack_98);
  LogTest::~LogTest(&LStack_98);
  return;
}

Assistant:

TEST(LogTest, ShortTrailer) {
  const int n = kBlockSize - 2 * kHeaderSize + 4;
  Write(BigString("foo", n));
  ASSERT_EQ(kBlockSize - kHeaderSize + 4, WrittenBytes());
  Write("");
  Write("bar");
  ASSERT_EQ(BigString("foo", n), Read());
  ASSERT_EQ("", Read());
  ASSERT_EQ("bar", Read());
  ASSERT_EQ("EOF", Read());
}